

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

double rand_next_uint64(uint64_t *next)

{
  uint64_t uVar1;
  undefined1 auVar2 [16];
  
  uVar1 = *next * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
  *next = uVar1;
  auVar2._8_4_ = (int)(uVar1 >> 0x20);
  auVar2._0_8_ = uVar1;
  auVar2._12_4_ = 0x45300000;
  return ((auVar2._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 5.421010862427522e-20;
}

Assistant:

double rand_next_uint64( uint64_t * next )
{
    /* According to Wikipedia this comes from Knuth */
    uint64_t a = 6364136223846793005;
    uint64_t c = 1442695040888963407;
    uint64_t x = (*next) * a + c; 
    *next =  x;
    return x / (1.0 + UINT64_MAX) ;
}